

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::XmlEncode::encodeTo(XmlEncode *this,ostream *os)

{
  byte bVar1;
  pointer pcVar2;
  ostream oVar3;
  undefined8 in_RAX;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  undefined8 uStack_38;
  
  if ((this->m_str)._M_string_length != 0) {
    uVar7 = 0;
    uStack_38 = in_RAX;
    do {
      pcVar2 = (this->m_str)._M_dataplus._M_p;
      bVar1 = pcVar2[uVar7];
      poVar4 = os;
      if (bVar1 < 0x3c) {
        if (bVar1 == 0x22) {
          if (this->m_forWhat == ForAttributes) {
            lVar5 = 6;
            pcVar6 = "&quot;";
          }
          else {
            uStack_38._0_6_ = CONCAT15(0x22,(undefined5)uStack_38);
            lVar5 = 1;
            pcVar6 = (char *)((long)&uStack_38 + 5);
          }
        }
        else if (bVar1 == 0x26) {
          lVar5 = 5;
          pcVar6 = "&amp;";
        }
        else {
LAB_0015091e:
          if (((char)bVar1 < '\t') || (bVar1 == 0x7f || (byte)(bVar1 - 0xe) < 0x12)) {
            std::__ostream_insert<char,std::char_traits<char>>(os,"&#x",3);
            lVar5 = *(long *)os;
            *(uint *)(os + *(long *)(lVar5 + -0x18) + 0x18) =
                 *(uint *)(os + *(long *)(lVar5 + -0x18) + 0x18) | 0x4000;
            *(uint *)(os + *(long *)(lVar5 + -0x18) + 0x18) =
                 *(uint *)(os + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
            poVar4 = os + *(long *)(lVar5 + -0x18);
            if (os[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
              oVar3 = (ostream)std::ios::widen((char)poVar4);
              poVar4[0xe0] = oVar3;
              poVar4[0xe1] = (ostream)0x1;
            }
            poVar4[0xe0] = (ostream)0x30;
            *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 2;
            poVar4 = (ostream *)std::ostream::operator<<(os,(int)(char)bVar1);
            uStack_38._0_7_ = CONCAT16(0x3b,(undefined6)uStack_38);
            lVar5 = 1;
            pcVar6 = (char *)((long)&uStack_38 + 6);
          }
          else {
            uStack_38 = CONCAT17(bVar1,(undefined7)uStack_38);
            lVar5 = 1;
            pcVar6 = (char *)((long)&uStack_38 + 7);
          }
        }
      }
      else if (bVar1 == 0x3e) {
        if (((uVar7 < 3) || (pcVar2[uVar7 - 1] != ']')) || (pcVar2[uVar7 - 2] != ']')) {
          uStack_38._0_5_ = CONCAT14(0x3e,(undefined4)uStack_38);
          lVar5 = 1;
          pcVar6 = (char *)((long)&uStack_38 + 4);
        }
        else {
          lVar5 = 4;
          pcVar6 = "&gt;";
        }
      }
      else {
        if (bVar1 != 0x3c) goto LAB_0015091e;
        lVar5 = 4;
        pcVar6 = "&lt;";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,lVar5);
      uVar7 = uVar7 + 1;
    } while (uVar7 < (this->m_str)._M_string_length);
  }
  return;
}

Assistant:

void encodeTo( std::ostream& os ) const {

            // Apostrophe escaping not necessary if we always use " to write attributes
            // (see: http://www.w3.org/TR/xml/#syntax)

            for( std::size_t i = 0; i < m_str.size(); ++ i ) {
                char c = m_str[i];
                switch( c ) {
                    case '<':   os << "&lt;"; break;
                    case '&':   os << "&amp;"; break;

                    case '>':
                        // See: http://www.w3.org/TR/xml/#syntax
                        if( i > 2 && m_str[i-1] == ']' && m_str[i-2] == ']' )
                            os << "&gt;";
                        else
                            os << c;
                        break;

                    case '\"':
                        if( m_forWhat == ForAttributes )
                            os << "&quot;";
                        else
                            os << c;
                        break;

                    default:
                        // Escape control chars - based on contribution by @espenalb in PR #465 and
                        // by @mrpi PR #588
                        if ( ( c < '\x09' ) || ( c > '\x0D' && c < '\x20') || c=='\x7F' )
                            os << "&#x" << std::uppercase << std::hex << std::setfill('0') << std::setw(2) << static_cast<int>( c ) << ';';
                        else
                            os << c;
                }
            }
        }